

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,SequentialStmtBlock *stmt)

{
  pointer pEVar1;
  uint64_t uVar2;
  pointer pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  string cond;
  
  local_58 = &cond._M_string_length;
  cond._M_dataplus._M_p = (pointer)0x0;
  cond._M_string_length._0_1_ = 0;
  pEVar1 = (stmt->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  cond.field_2._8_8_ = this;
  for (pEVar3 = (stmt->conditions_).
                super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar1; pEVar3 = pEVar3 + 1) {
    if (pEVar3->edge == Posedge) {
      (*(pEVar3->var->super_IRNode)._vptr_IRNode[0x1f])(&local_98);
      std::operator+(&local_78,"1",&local_98);
      std::__cxx11::string::append((string *)&local_58);
    }
    else {
      (*(pEVar3->var->super_IRNode)._vptr_IRNode[0x1f])(&local_98);
      std::operator+(&local_78,"0",&local_98);
      std::__cxx11::string::append((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  uVar2 = hash_64_fnv1a(local_58,(uint64_t)cond._M_dataplus._M_p);
  local_78._M_dataplus._M_p =
       (pointer)(uVar2 << (*(byte *)(cond.field_2._8_8_ + 8) & 0x3f) ^ 0xf1bbcdcbfa53e0b4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(cond.field_2._8_8_ + 0x60),
             (unsigned_long *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void visit(SequentialStmtBlock* stmt) override {
        std::string cond;
        auto const& conditions = stmt->get_event_controls();
        for (auto const& event_control : conditions) {
            if (event_control.edge == EventEdgeType::Posedge)
                cond.append("1" + event_control.var->to_string());
            else
                cond.append("0" + event_control.var->to_string());
        }
        uint64_t hash = hash_64_fnv1a(cond.c_str(), cond.size()) << level;
        constexpr uint64_t seq_signature = shift_const(0x9e3779b97f4a7c16, 3);
        stmt_hashes_.emplace_back(hash ^ seq_signature);
    }